

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllTypes.cpp
# Opt level: O1

Type * slang::ast::PackedStructType::fromSyntax
                 (Compilation *comp,StructUnionTypeSyntax *syntax,ASTContext *parentContext)

{
  bool *pbVar1;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> this;
  size_t sVar2;
  SyntaxNode *syntax_00;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> pSVar3;
  long lVar4;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_01;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bitwidth_t bVar8;
  uint uVar9;
  Type *pTVar10;
  SourceLocation SVar11;
  Diagnostic *pDVar12;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar13;
  Type *this_00;
  pointer ppSVar14;
  long lVar15;
  ulong uVar16;
  StructUnionTypeSyntax *pSVar17;
  bool bVar18;
  SourceRange SVar19;
  bool isSigned;
  FieldSymbol *field;
  ASTContext context;
  SmallVector<slang::ast::FieldSymbol_*,_5UL> members;
  bool local_119;
  StructUnionMemberSyntax *local_118;
  PackedStructType *local_110;
  Compilation *local_108;
  Token local_100;
  Type *local_f0;
  uint local_e8 [2];
  StructUnionTypeSyntax *local_e0;
  Scope *local_d8;
  FieldSymbol *local_d0;
  ASTContext *local_c8;
  pointer local_c0;
  pointer local_b8;
  SourceLocation local_b0;
  ASTContext local_a8;
  SourceLocation local_70;
  long local_68;
  undefined8 local_60;
  undefined1 local_58 [40];
  
  local_119 = (syntax->signing).kind == SignedKeyword;
  local_70 = parsing::Token::location(&syntax->keyword);
  local_108 = comp;
  local_110 = BumpAllocator::
              emplace<slang::ast::PackedStructType,slang::ast::Compilation&,bool_const&,slang::SourceLocation,slang::ast::ASTContext_const&>
                        (&comp->super_BumpAllocator,comp,&local_119,&local_70,parentContext);
  (local_110->super_IntegralType).super_Type.super_Symbol.originatingSyntax = (SyntaxNode *)syntax;
  local_d8 = &local_110->super_Scope;
  local_a8.flags.m_bits = (parentContext->flags).m_bits;
  local_a8.lookupIndex = 0xffffffff;
  local_a8.instanceOrProc = (Symbol *)0x0;
  local_a8.firstTempVar = (TempVarSymbol *)0x0;
  local_a8.randomizeDetails = (RandomizeDetails *)0x0;
  local_a8.assertionInstance = (AssertionInstanceDetails *)0x0;
  local_70 = (SourceLocation)local_58;
  local_68 = 0;
  local_60 = 5;
  sVar2 = (syntax->members).
          super_span<slang::syntax::StructUnionMemberSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  bVar18 = sVar2 == 0;
  local_c8 = parentContext;
  local_a8.scope.ptr = local_d8;
  if (bVar18) {
    bVar5 = false;
    pSVar17 = syntax;
  }
  else {
    ppSVar14 = (syntax->members).
               super_span<slang::syntax::StructUnionMemberSyntax_*,_18446744073709551615UL>._M_ptr;
    local_c0 = ppSVar14 + sVar2;
    bVar5 = false;
    local_e0 = syntax;
    do {
      local_118 = *ppSVar14;
      syntax_00 = (local_118->super_SyntaxNode).previewNode;
      if (syntax_00 != (SyntaxNode *)0x0) {
        Scope::addMembers(local_d8,syntax_00);
      }
      pTVar10 = Compilation::getType(local_108,(local_118->type).ptr,&local_a8,(Type *)0x0);
      bVar6 = Type::isFourState(pTVar10);
      pbVar1 = &(local_110->super_IntegralType).isFourState;
      *pbVar1 = (bool)(*pbVar1 | bVar6);
      if (pTVar10->canonical == (Type *)0x0) {
        Type::resolveCanonical(pTVar10);
      }
      bVar5 = (bool)(bVar5 | (pTVar10->canonical->super_Symbol).kind == ErrorType);
      if ((!bVar5) && (bVar6 = Type::isIntegral(pTVar10), !bVar6)) {
        local_100 = slang::syntax::SyntaxNode::getFirstToken((SyntaxNode *)(local_118->type).ptr);
        SVar11 = parsing::Token::location(&local_100);
        pDVar12 = ASTContext::addDiag(&local_a8,(DiagCode)0x1c0009,SVar11);
        ast::operator<<(pDVar12,pTVar10);
        SVar19 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)(local_118->type).ptr);
        bVar5 = true;
        Diagnostic::operator<<(pDVar12,SVar19);
      }
      uVar16 = (local_118->declarators).elements._M_extent._M_extent_value + 1;
      bVar6 = uVar16 < 2;
      local_b8 = ppSVar14;
      if (!bVar6) {
        uVar16 = uVar16 >> 1;
        lVar15 = 0;
        do {
          ppSVar13 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                               ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *
                                )((long)&(((local_118->declarators).elements._M_ptr)->
                                         super_ConstTokenOrSyntax).
                                         super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                         .
                                         super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                         .
                                         super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                         .
                                         super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                 + lVar15));
          pSVar3 = *ppSVar13;
          this = pSVar3 + 1;
          local_100 = (Token)parsing::Token::valueText((Token *)this);
          local_b0 = parsing::Token::location((Token *)this);
          local_e8[1] = 0;
          local_e8[0] = (uint)local_68;
          local_d0 = BumpAllocator::
                     emplace<slang::ast::FieldSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,unsigned_int,unsigned_int>
                               (&local_108->super_BumpAllocator,
                                (basic_string_view<char,_std::char_traits<char>_> *)&local_100,
                                &local_b0,local_e8 + 1,local_e8);
          (local_d0->super_VariableSymbol).super_ValueSymbol.declaredType.type = pTVar10;
          (local_d0->super_VariableSymbol).super_ValueSymbol.super_Symbol.originatingSyntax = pSVar3
          ;
          syntax_01._M_ptr =
               (local_118->attributes).
               super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
          syntax_01._M_extent._M_extent_value =
               (local_118->attributes).
               super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
               _M_extent._M_extent_value;
          Symbol::setAttributes((Symbol *)local_d0,local_a8.scope.ptr,syntax_01);
          Scope::insertMember(local_d8,(Symbol *)local_d0,(local_110->super_Scope).lastMember,false,
                              true);
          SmallVectorBase<slang::ast::FieldSymbol*>::emplace_back<slang::ast::FieldSymbol*const&>
                    ((SmallVectorBase<slang::ast::FieldSymbol*> *)&local_70,&local_d0);
          this_00 = Compilation::getType
                              (local_108,pTVar10,
                               (SyntaxList<slang::syntax::VariableDimensionSyntax> *)
                               &pSVar3[1].previewNode,&local_a8);
          bVar7 = Type::isUnpackedArray(this_00);
          if ((bVar7) && (!bVar5)) {
            SVar19 = parsing::Token::range((Token *)this);
            pDVar12 = ASTContext::addDiag(&local_a8,(DiagCode)0x1c0009,SVar19);
            ast::operator<<(pDVar12,this_00);
            SVar19 = slang::syntax::SyntaxNode::sourceRange(pSVar3 + 2);
            bVar5 = true;
            Diagnostic::operator<<(pDVar12,SVar19);
          }
          bVar8 = Type::getBitWidth(pTVar10);
          uVar9 = bVar8 + (local_110->super_IntegralType).bitWidth;
          (local_110->super_IntegralType).bitWidth = uVar9;
          if (0xffffff < uVar9 && !bVar5) {
            SVar19 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_e0);
            pDVar12 = ASTContext::addDiag(&local_a8,(DiagCode)0x1d0009,SVar19);
            local_100._0_8_ = (ulong)(local_110->super_IntegralType).bitWidth;
            std::
            vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
            ::emplace_back<unsigned_long>(&pDVar12->args,(unsigned_long *)&local_100);
            local_100.kind = ~Unknown;
            local_100._2_1_ = 0xff;
            local_100.numFlags.raw = '\0';
            local_100.rawLen = 0;
            std::
            vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
            ::emplace_back<unsigned_long>(&pDVar12->args,(unsigned_long *)&local_100);
            local_f0 = local_108->errorType;
          }
          else if (*(long *)(pSVar3 + 4) != 0) {
            SVar11 = parsing::Token::location((Token *)(*(long *)(pSVar3 + 4) + 0x18));
            pDVar12 = ASTContext::addDiag(&local_a8,(DiagCode)0x1b0009,SVar11);
            SVar19 = slang::syntax::SyntaxNode::sourceRange
                               (*(SyntaxNode **)(*(long *)(pSVar3 + 4) + 0x28));
            Diagnostic::operator<<(pDVar12,SVar19);
          }
          if (0xffffff < uVar9 && !bVar5) break;
          lVar15 = lVar15 + 0x30;
          uVar16 = uVar16 - 1;
          bVar6 = uVar16 == 0;
        } while (!bVar6);
      }
      pSVar17 = local_e0;
      if (!bVar6) break;
      ppSVar14 = local_b8 + 1;
      bVar18 = ppSVar14 == local_c0;
    } while (!bVar18);
  }
  SVar11 = local_70;
  if (bVar18) {
    if ((local_110->super_IntegralType).bitWidth == 0 || bVar5) {
      local_f0 = local_108->errorType;
    }
    else {
      if (local_68 != 0) {
        lVar15 = local_68 << 3;
        uVar16 = 0;
        do {
          lVar4 = *(long *)((undefined1 *)((long)SVar11 + -8) + lVar15);
          *(ulong *)(lVar4 + 0x158) = uVar16;
          pTVar10 = DeclaredType::getType((DeclaredType *)(lVar4 + 0x40));
          bVar8 = Type::getBitWidth(pTVar10);
          uVar16 = (ulong)((int)uVar16 + bVar8);
          lVar15 = lVar15 + -8;
        } while (lVar15 != 0);
      }
      local_f0 = anon_unknown.dwarf_14d6ca7::createPackedDims
                           (local_c8,(Type *)local_110,&pSVar17->dimensions);
    }
  }
  if (local_70 != (SourceLocation)local_58) {
    operator_delete((void *)local_70);
  }
  return local_f0;
}

Assistant:

const Type& PackedStructType::fromSyntax(Compilation& comp, const StructUnionTypeSyntax& syntax,
                                         const ASTContext& parentContext) {
    SLANG_ASSERT(syntax.packed);
    const bool isSigned = syntax.signing.kind == TokenKind::SignedKeyword;
    bool issuedError = false;

    auto structType = comp.emplace<PackedStructType>(comp, isSigned, syntax.keyword.location(),
                                                     parentContext);
    structType->setSyntax(syntax);

    ASTContext context(*structType, LookupLocation::max, parentContext.flags);

    SmallVector<FieldSymbol*> members;
    for (auto member : syntax.members) {
        if (member->previewNode)
            structType->addMembers(*member->previewNode);

        const Type& type = comp.getType(*member->type, context);
        structType->isFourState |= type.isFourState();
        issuedError |= type.isError();

        if (!issuedError && !type.isIntegral()) {
            issuedError = true;
            auto& diag = context.addDiag(diag::PackedMemberNotIntegral,
                                         member->type->getFirstToken().location());
            diag << type;
            diag << member->type->sourceRange();
        }

        for (auto decl : member->declarators) {
            auto field = comp.emplace<FieldSymbol>(decl->name.valueText(), decl->name.location(),
                                                   0u, (uint32_t)members.size());
            field->setType(type);
            field->setSyntax(*decl);
            field->setAttributes(*context.scope, member->attributes);
            structType->addMember(*field);
            members.push_back(field);

            // Unpacked arrays are disallowed in packed structs.
            if (const Type& dimType = comp.getType(type, decl->dimensions, context);
                dimType.isUnpackedArray() && !issuedError) {

                auto& diag = context.addDiag(diag::PackedMemberNotIntegral, decl->name.range());
                diag << dimType;
                diag << decl->dimensions.sourceRange();
                issuedError = true;
            }

            structType->bitWidth += type.getBitWidth();
            if (!issuedError && structType->bitWidth > (uint32_t)SVInt::MAX_BITS) {
                context.addDiag(diag::PackedTypeTooLarge, syntax.sourceRange())
                    << structType->bitWidth << (uint32_t)SVInt::MAX_BITS;
                return comp.getErrorType();
            }

            if (decl->initializer) {
                auto& diag = context.addDiag(diag::PackedMemberHasInitializer,
                                             decl->initializer->equals.location());
                diag << decl->initializer->expr->sourceRange();
            }
        }
    }

    if (!structType->bitWidth || issuedError)
        return comp.getErrorType();

    // We added the fields in reverse order, so compute their actual
    // offsets in the right order now.
    bitwidth_t offset = 0;
    for (auto member : std::views::reverse(members)) {
        member->bitOffset = offset;
        offset += member->getType().getBitWidth();
    }

    return createPackedDims(parentContext, structType, syntax.dimensions);
}